

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsInt(CodedInputStream *this,int *value)

{
  uint8 *puVar1;
  int iVar2;
  bool bVar3;
  
  puVar1 = this->buffer_;
  if ((puVar1 < this->buffer_end_) && (-1 < (char)*puVar1)) {
    *value = (int)(char)*puVar1;
    this->buffer_ = puVar1 + 1;
    bVar3 = true;
  }
  else {
    iVar2 = ReadVarintSizeAsIntFallback(this);
    *value = iVar2;
    bVar3 = -1 < iVar2;
  }
  return bVar3;
}

Assistant:

inline bool CodedInputStream::ReadVarintSizeAsInt(int* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_)) {
    int v = *buffer_;
    if (v < 0x80) {
      *value = v;
      Advance(1);
      return true;
    }
  }
  *value = ReadVarintSizeAsIntFallback();
  return *value >= 0;
}